

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O0

void __thiscall Assimp::glTF2Importer::ImportMaterials(glTF2Importer *this,Asset *r)

{
  aiMaterial **ppaVar1;
  aiMaterial *paVar2;
  Material *mat;
  uint local_1b8;
  uint i;
  undefined1 local_1a8 [8];
  Material defaultMaterial;
  uint numImportedMaterials;
  Asset *r_local;
  glTF2Importer *this_local;
  
  defaultMaterial._388_4_ = glTF2::LazyDict<glTF2::Material>::Size(&r->materials);
  glTF2::Material::Material((Material *)local_1a8);
  this->mScene->mNumMaterials = defaultMaterial._388_4_ + 1;
  ppaVar1 = (aiMaterial **)operator_new__((ulong)this->mScene->mNumMaterials << 3);
  this->mScene->mMaterials = ppaVar1;
  paVar2 = ImportMaterial(&this->embeddedTexIdxs,r,(Material *)local_1a8);
  this->mScene->mMaterials[(uint)defaultMaterial._388_4_] = paVar2;
  for (local_1b8 = 0; local_1b8 < (uint)defaultMaterial._388_4_; local_1b8 = local_1b8 + 1) {
    mat = glTF2::LazyDict<glTF2::Material>::operator[](&r->materials,(ulong)local_1b8);
    paVar2 = ImportMaterial(&this->embeddedTexIdxs,r,mat);
    this->mScene->mMaterials[local_1b8] = paVar2;
  }
  glTF2::Material::~Material((Material *)local_1a8);
  return;
}

Assistant:

void glTF2Importer::ImportMaterials(glTF2::Asset& r)
{
    const unsigned int numImportedMaterials = unsigned(r.materials.Size());
    Material defaultMaterial;

    mScene->mNumMaterials = numImportedMaterials + 1;
    mScene->mMaterials = new aiMaterial*[mScene->mNumMaterials];
    mScene->mMaterials[numImportedMaterials] = ImportMaterial(embeddedTexIdxs, r, defaultMaterial);

    for (unsigned int i = 0; i < numImportedMaterials; ++i) {
       mScene->mMaterials[i] = ImportMaterial(embeddedTexIdxs, r, r.materials[i]);
    }
}